

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.cpp
# Opt level: O0

sstring_view<std::shared_ptr<const_char>_> *
pstore::make_shared_sstring_view
          (sstring_view<std::shared_ptr<const_char>_> *__return_storage_ptr__,czstring str)

{
  void *pvVar1;
  char *__last;
  element_type *__result;
  __shared_count<(__gnu_cxx::_Lock_policy)2> length_00;
  shared_ptr<const_char> local_58 [2];
  undefined1 local_30 [8];
  shared_ptr<char> ptr;
  size_t length;
  czstring str_local;
  
  ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)strlen(str);
  pvVar1 = operator_new__((ulong)ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
  std::shared_ptr<char>::shared_ptr<char,pstore::make_shared_sstring_view(char_const*)::__0,void>
            ((shared_ptr<char> *)local_30,pvVar1);
  __last = str + (long)ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  length_00 = ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  __result = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  std::copy<char_const*,char*>(str,__last,__result);
  std::static_pointer_cast<char_const,char>((shared_ptr<char> *)local_58);
  make_shared_sstring_view<char_const>
            (__return_storage_ptr__,(pstore *)local_58,
             (shared_ptr<const_char> *)
             ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             (size_t)length_00._M_pi);
  std::shared_ptr<const_char>::~shared_ptr(local_58);
  std::shared_ptr<char>::~shared_ptr((shared_ptr<char> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

sstring_view<std::shared_ptr<char const>> make_shared_sstring_view (gsl::czstring const str) {
        auto const length = std::strlen (str);
        auto const ptr =
            std::shared_ptr<char> (new char[length], [] (gsl::czstring const p) { delete[] p; });
        std::copy (str, str + length, ptr.get ());
        return pstore::make_shared_sstring_view (std::static_pointer_cast<char const> (ptr),
                                                 length);
    }